

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::anon_unknown_0::IsinfCaseInstance::getInputValues
          (IsinfCaseInstance *this,int numValues,void **values)

{
  char cVar1;
  pointer pSVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  Random rnd;
  deRandom local_40;
  
  dVar4 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar4 ^ 0xc2a39f);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  iVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  cVar1 = (&DAT_00b8730c)[(ulong)uVar6 * 4];
  if (0 < iVar5 * numValues) {
    uVar7 = 0;
    do {
      fVar9 = deRandom_getFloat(&local_40);
      uVar6 = 0;
      bVar3 = false;
      if (fVar9 <= 0.3) {
        fVar10 = deRandom_getFloat(&local_40);
        bVar3 = 0.4 < fVar10;
        dVar4 = deRandom_getUint32(&local_40);
        uVar6 = dVar4 & (0x3fffffU >> (0x17U - cVar1 & 0x1f)) << (0x17U - cVar1 & 0x1f) | 0x400000;
      }
      uVar8 = 0x7f800000;
      if (!(bool)(0.3 < fVar9 | bVar3)) {
        dVar4 = deRandom_getUint32(&local_40);
        uVar8 = (dVar4 & 0x7f) << 0x17;
      }
      dVar4 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)*values + uVar7 * 4) = dVar4 << 0x1f | uVar8 | uVar6;
      uVar7 = uVar7 + 1;
    } while ((uint)(iVar5 * numValues) != uVar7);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(m_name) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isInf		= rnd.getFloat() > 0.3f;
			const bool		isNan		= !isInf && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}